

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O1

void Cbs_ManDeriveReason(Cbs_Man_t *p,int Level)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  void **ppvVar5;
  Gia_Obj_t **ppGVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  Gia_Obj_t *pGVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  lVar11 = (long)(p->pClauses).iHead;
  if ((p->pClauses).pData[lVar11] != (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x25f,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  uVar12 = lVar11 + 1;
  iVar10 = (int)uVar12;
  if ((p->pClauses).iTail <= iVar10) {
    __assert_fail("pQue->iHead + 1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x260,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  p->vTemp->nSize = 0;
  if (iVar10 < (p->pClauses).iTail) {
    uVar13 = uVar12 & 0xffffffff;
    do {
      pGVar9 = (p->pClauses).pData[uVar12];
      if (((uint)*(ulong *)pGVar9 >> 0x1e & 1) != 0) {
        *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xffffffffbfffffff;
        pVVar8 = p->vTemp;
        uVar7 = pVVar8->nCap;
        if (pVVar8->nSize == uVar7) {
          if ((int)uVar7 < 0x10) {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar8->pArray,0x80);
            }
            pVVar8->pArray = ppvVar5;
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar7 * 2;
            if (iVar10 <= (int)uVar7) goto LAB_007149a6;
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
            }
            pVVar8->pArray = ppvVar5;
          }
          pVVar8->nCap = iVar10;
        }
LAB_007149a6:
        iVar10 = pVVar8->nSize;
        pVVar8->nSize = iVar10 + 1;
        pVVar8->pArray[iVar10] = pGVar9;
        uVar7 = pGVar9->Value;
        if (uVar7 == 0xffffffff) {
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,99,"int Cbs_VarDecLevel(Cbs_Man_t *, Gia_Obj_t *)");
        }
        uVar3 = uVar7 * 3;
        if ((int)uVar3 < 0) {
LAB_00714b7f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar1 = p->vLevReas->nSize;
        if (uVar1 == uVar3 || SBORROW4(uVar1,uVar3) != (int)(uVar1 + uVar7 * -3) < 0)
        goto LAB_00714b7f;
        piVar2 = p->vLevReas->pArray;
        iVar10 = piVar2[uVar3];
        if (iVar10 < Level) {
          ppGVar6 = (p->pClauses).pData;
          iVar10 = (int)uVar13;
          uVar13 = (ulong)(iVar10 + 1);
        }
        else {
          if (iVar10 != Level) {
            __assert_fail("iLitLevel == Level",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x279,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
          }
          uVar3 = uVar3 + 1;
          if (((int)uVar3 < 0) || ((int)uVar1 <= (int)uVar3)) goto LAB_00714b7f;
          lVar11 = (long)piVar2[uVar3];
          if (lVar11 == 0) {
            ppGVar6 = (p->pClauses).pData;
            iVar10 = (p->pClauses).iHead;
          }
          else {
            if (((ulong)(pGVar9 + lVar11) & 1) != 0) {
LAB_00714bbd:
              __assert_fail("!Gia_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                            ,0x120,"void Cbs_QuePush(Cbs_Que_t *, Gia_Obj_t *)");
            }
            iVar10 = (p->pClauses).nSize;
            if ((p->pClauses).iTail == iVar10) {
              (p->pClauses).nSize = iVar10 * 2;
              ppGVar6 = (p->pClauses).pData;
              if (ppGVar6 == (Gia_Obj_t **)0x0) {
                ppGVar6 = (Gia_Obj_t **)malloc((long)iVar10 << 4);
              }
              else {
                ppGVar6 = (Gia_Obj_t **)realloc(ppGVar6,(long)iVar10 << 4);
              }
              (p->pClauses).pData = ppGVar6;
            }
            iVar10 = (p->pClauses).iTail;
            iVar4 = iVar10 + 1;
            (p->pClauses).iTail = iVar4;
            (p->pClauses).pData[iVar10] = pGVar9 + lVar11;
            if (pGVar9->Value == 0xffffffff) {
              __assert_fail("pVar->Value != ~0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                            ,0x65,"Gia_Obj_t *Cbs_VarReason1(Cbs_Man_t *, Gia_Obj_t *)");
            }
            uVar7 = pGVar9->Value * 3 + 2;
            if (((int)uVar7 < 0) || (p->vLevReas->nSize <= (int)uVar7)) goto LAB_00714b7f;
            lVar11 = (long)p->vLevReas->pArray[uVar7];
            if (lVar11 == 0) goto LAB_00714b13;
            pGVar9 = pGVar9 + lVar11;
            if (((ulong)pGVar9 & 1) != 0) goto LAB_00714bbd;
            iVar10 = (p->pClauses).nSize;
            if (iVar4 == iVar10) {
              (p->pClauses).nSize = iVar10 * 2;
              ppGVar6 = (p->pClauses).pData;
              if (ppGVar6 == (Gia_Obj_t **)0x0) {
                ppGVar6 = (Gia_Obj_t **)malloc((long)iVar10 << 4);
              }
              else {
                ppGVar6 = (Gia_Obj_t **)realloc(ppGVar6,(long)iVar10 << 4);
              }
              (p->pClauses).pData = ppGVar6;
            }
            ppGVar6 = (p->pClauses).pData;
            iVar10 = (p->pClauses).iTail;
            (p->pClauses).iTail = iVar10 + 1;
          }
        }
        ppGVar6[iVar10] = pGVar9;
      }
LAB_00714b13:
      iVar10 = (int)uVar13;
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)(p->pClauses).iTail);
  }
  if ((p->pClauses).pData[(p->pClauses).iHead] == (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x286,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  (p->pClauses).iTail = iVar10;
  pVVar8 = p->vTemp;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      *(ulong *)pVVar8->pArray[lVar11] = *pVVar8->pArray[lVar11] | 0x40000000;
      lVar11 = lVar11 + 1;
      pVVar8 = p->vTemp;
    } while (lVar11 < pVVar8->nSize);
  }
  return;
}

Assistant:

static inline void Cbs_ManDeriveReason( Cbs_Man_t * p, int Level )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj, * pReason;
    int i, k, iLitLevel;
    assert( pQue->pData[pQue->iHead] == NULL );
    assert( pQue->iHead + 1 < pQue->iTail );
/*
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        assert( pObj->fMark0 == 1 );
    }
*/
    // compact literals
    Vec_PtrClear( p->vTemp );
    for ( i = k = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Vec_PtrPush( p->vTemp, pObj );
        // check decision level
        iLitLevel = Cbs_VarDecLevel( p, pObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = pObj;
            continue;
        }
        assert( iLitLevel == Level );
        pReason = Cbs_VarReason0( p, pObj );
        if ( pReason == pObj ) // no reason
        {
            //assert( pQue->pData[pQue->iHead] == NULL );
            pQue->pData[pQue->iHead] = pObj;
            continue;
        }
        Cbs_QuePush( pQue, pReason );
        pReason = Cbs_VarReason1( p, pObj );
        if ( pReason != pObj ) // second reason
            Cbs_QuePush( pQue, pReason );
    }
    assert( pQue->pData[pQue->iHead] != NULL );
    pQue->iTail = k;
    // clear the marks
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vTemp, pObj, i )
        pObj->fMark0 = 1;
}